

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

BroadcastToStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_broadcasttostatic
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x451) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x451;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.broadcasttostatic_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::BroadcastToStaticLayerParams>(arena);
    (this->layer_).broadcasttostatic_ = (BroadcastToStaticLayerParams *)LVar2;
  }
  return (BroadcastToStaticLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToStaticLayerParams* NeuralNetworkLayer::_internal_mutable_broadcasttostatic() {
  if (!_internal_has_broadcasttostatic()) {
    clear_layer();
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = CreateMaybeMessage< ::CoreML::Specification::BroadcastToStaticLayerParams >(GetArenaForAllocation());
  }
  return layer_.broadcasttostatic_;
}